

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_read_file_to_buffer
               (char *filename,uint64_t maxsize,int require_text,uint64_t *user_result_size,
               char **user_result_buf)

{
  uint uVar1;
  int iVar2;
  char *dest;
  long *in_RCX;
  int in_EDX;
  mcpl_buffer_t *in_RSI;
  undefined8 *in_R8;
  uint nread_actual;
  uint max_in_this_go;
  size_t nread_max;
  uint max_at_a_time;
  mcpl_buffer_t out;
  mcpl_generic_filehandle_t file;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint nbytes;
  mcpl_buffer_t *n;
  mcpl_buffer_t *buf;
  uint uVar3;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 uVar4;
  mcpl_buffer_t local_60 [2];
  mcpl_buffer_t *in_stack_ffffffffffffffd0;
  mcpl_buffer_t *local_10;
  
  local_10 = in_RSI;
  if (in_RSI == (mcpl_buffer_t *)0x0) {
    local_10 = (mcpl_buffer_t *)0xffffffffffffffff;
  }
  mcpl_generic_fopen((char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  buf = local_10;
  if ((mcpl_buffer_t *)0xffff < local_10) {
    buf = (mcpl_buffer_t *)0x10000;
  }
  mcpl_internal_buf_create(CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  uVar4 = 0x7fffffff;
  do {
    if (0x100ffffffff < local_60[0].capacity) {
      mcpl_error((char *)0x10ae5f);
    }
    if (local_60[0].capacity - local_60[0].size < 0x7fffffff) {
      n = local_10;
      if ((mcpl_buffer_t *)(local_60[0].capacity * 2) < local_10 ||
          (long)(local_60[0].capacity * 2) - (long)local_10 == 0) {
        n = (mcpl_buffer_t *)(local_60[0].capacity << 1);
      }
      mcpl_internal_buf_reserve(buf,(size_t)n);
    }
    dest = (char *)(local_60[0].capacity - local_60[0].size);
    if (dest < (char *)0x80000000) {
      nbytes = (uint)dest;
    }
    else {
      nbytes = 0x7fffffff;
    }
    uVar3 = nbytes;
    uVar1 = mcpl_generic_fread_try
                      ((mcpl_generic_filehandle_t *)CONCAT44(uVar4,in_stack_ffffffffffffff98),dest,
                       nbytes);
    local_60[0].size = (long)(char **)local_60[0].size + (ulong)uVar1;
  } while ((uVar3 <= uVar1) && ((mcpl_buffer_t *)local_60[0].size != local_10));
  mcpl_generic_fclose((mcpl_generic_filehandle_t *)0x10af38);
  if (in_EDX != 0) {
    iVar2 = mcpl_buf_is_text(local_60);
    if (iVar2 == 0) {
      mcpl_error((char *)0x10af5d);
    }
    mcpl_internal_normalise_eol(in_stack_ffffffffffffffd0);
  }
  mcpl_internal_buf_squeeze((mcpl_buffer_t *)CONCAT44(nbytes,in_stack_ffffffffffffff70));
  *in_RCX = local_60[0].size;
  *in_R8 = local_60[0].buf;
  return;
}

Assistant:

void mcpl_read_file_to_buffer( const char * filename,
                               uint64_t maxsize,
                               int require_text,
                               uint64_t* user_result_size,
                               char ** user_result_buf )
{
  MCPL_STATIC_ASSERT( sizeof(size_t) >= sizeof(uint64_t) );

  if ( maxsize == 0 )
    maxsize = UINT64_MAX;

  mcpl_generic_filehandle_t file = mcpl_generic_fopen( filename );
  mcpl_buffer_t out = mcpl_internal_buf_create( 65536 > maxsize
                                                ? maxsize
                                                : 65536 );

  const unsigned max_at_a_time = INT32_MAX;

  while (1) {
    if ( out.capacity >= 1103806595072 )
      mcpl_error("mcpl_read_file_to_buffer trying to load more than 1TB");
    if ( out.capacity - out.size < max_at_a_time )
      mcpl_internal_buf_reserve( &out, ( out.capacity * 2 > (size_t)maxsize
                                         ? (size_t)maxsize
                                         : out.capacity*2) );
    size_t nread_max = out.capacity - out.size;
    unsigned max_in_this_go = ( nread_max > max_at_a_time
                                ? max_at_a_time
                                : (unsigned)nread_max );
    unsigned nread_actual = mcpl_generic_fread_try( &file,
                                                    out.buf + out.size,
                                                    max_in_this_go );
    out.size += nread_actual;
    if ( nread_actual < max_in_this_go || out.size == maxsize )
      break;//no more to read
  }

  mcpl_generic_fclose( &file );

  if ( require_text ) {
    if ( !mcpl_buf_is_text(&out) )
      mcpl_error("File is not a text file");
    mcpl_internal_normalise_eol(&out);
  }

  //Discard excess allocations:
  mcpl_internal_buf_squeeze( &out );

  //Done:
  *user_result_size = out.size;
  *user_result_buf = out.buf;
}